

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int attrset_read_attr_set_v1(BigAttrSet *attrset,char *basename)

{
  long lVar1;
  long lVar2;
  char attrset_00 [8];
  int iVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *attrname;
  size_t __size;
  undefined1 auStack_68 [8];
  char local_60 [8];
  char dtype [9];
  char local_4e [6];
  char ndtype [8];
  int local_3c;
  int local_38;
  int nmemb;
  int lname;
  
  attrset->dirty = 0;
  iVar4 = 0;
  ndtype = (char  [8])attrset;
  __stream = (FILE *)_big_file_open_a_file(basename,-2,"r",0);
  if (__stream != (FILE *)0x0) {
    dtype[0] = '\0';
    local_60[0] = '\0';
    local_60[1] = '\0';
    local_60[2] = '\0';
    local_60[3] = '\0';
    local_60[4] = '\0';
    local_60[5] = '\0';
    local_60[6] = '\0';
    local_60[7] = '\0';
    pcVar6 = auStack_68;
    do {
      builtin_strncpy(pcVar6 + -8,"O:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar3 = feof(__stream);
      iVar4 = 0;
      if (iVar3 != 0) goto LAB_00103bae;
      builtin_strncpy(pcVar6 + -8,"p:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(&local_3c,4,1,__stream);
      if (sVar5 != 1) goto LAB_00103bae;
      pcVar6[-8] = -0x70;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(&local_38,4,1,__stream);
      if (sVar5 != 1) {
LAB_00103b79:
        pcVar7 = "Failed to read from file";
        iVar4 = 0x5b0;
        goto LAB_00103ba1;
      }
      pcVar6[-8] = -0x51;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(local_60,8,1,__stream);
      if (sVar5 != 1) goto LAB_00103b79;
      pcVar6[-8] = -0x3f;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = dtype_isvalid(local_60);
      if (iVar4 == 0) goto LAB_00103b79;
      pcVar6[-8] = -0x2b;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      _dtype_normalize(dtype + 8,local_60);
      pcVar6[-8] = -0x22;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = atoi(local_4e);
      nmemb = local_3c;
      iVar4 = iVar4 * local_3c;
      lVar1 = -((long)iVar4 + 0xfU & 0xfffffffffffffff0);
      pcVar7 = pcVar6 + lVar1;
      __size = (size_t)local_38;
      lVar2 = -(__size + 0x10 & 0xfffffffffffffff0);
      attrname = pcVar7 + lVar2;
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"#;\x10",4);
      attrname[-4] = '\0';
      attrname[-3] = '\0';
      attrname[-2] = '\0';
      attrname[-1] = '\0';
      sVar5 = fread(attrname,__size,1,__stream);
      if (sVar5 != 1) {
LAB_00103b8e:
        pcVar7 = "Failed to read from file";
        iVar4 = 0x5b8;
        pcVar6 = attrname;
        goto LAB_00103ba1;
      }
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"<;\x10",4);
      attrname[-4] = '\0';
      attrname[-3] = '\0';
      attrname[-2] = '\0';
      attrname[-1] = '\0';
      sVar5 = fread(pcVar7,(long)iVar4,1,__stream);
      if (sVar5 != 1) goto LAB_00103b8e;
      attrname[__size] = '\0';
      iVar4 = nmemb;
      attrset_00 = ndtype;
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"a;\x10",4);
      attrname[-4] = '\0';
      attrname[-3] = '\0';
      attrname[-2] = '\0';
      attrname[-1] = '\0';
      iVar4 = attrset_set_attr((BigAttrSet *)attrset_00,attrname,pcVar7,local_60,iVar4);
      pcVar6 = attrname;
    } while (iVar4 == 0);
    pcVar7 = (char *)0x0;
    iVar4 = 0x5bd;
LAB_00103ba1:
    pcVar6[-8] = -0x58;
    pcVar6[-7] = ';';
    pcVar6[-6] = '\x10';
    pcVar6[-5] = '\0';
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    _big_file_raise(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,iVar4);
    iVar4 = -1;
LAB_00103bae:
    *(undefined4 *)ndtype = 0;
    *(undefined8 *)(pcVar6 + -8) = 0x103bc0;
    fclose(__stream);
  }
  return iVar4;
}

Assistant:

static int
attrset_read_attr_set_v1(BigAttrSet * attrset, const char * basename)
{
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR, "r", 0);
    if(fattr == NULL) {
        return 0;
    }
    int nmemb;
    int lname;
    char dtype[9]={0};
    char * data;
    char * name;
    while(!feof(fattr)) {
        if(1 != fread(&nmemb, sizeof(int), 1, fattr)) break;
        RAISEIF(
            (1 != fread(&lname, sizeof(int), 1, fattr)) ||
            (1 != fread(&dtype, 8, 1, fattr)) ||
            (!dtype_isvalid(dtype)),
            ex_fread,
            "Failed to read from file"
                )
        int ldata = big_file_dtype_itemsize(dtype) * nmemb;
        data = alloca(ldata);
        name = alloca(lname + 1);
        RAISEIF(
            (1 != fread(name, lname, 1, fattr)) ||
            (1 != fread(data, ldata, 1, fattr)),
            ex_fread,
            "Failed to read from file");

        name[lname] = 0;
        RAISEIF(0 != attrset_set_attr(attrset, name, data, dtype, nmemb),
            ex_set_attr,
            NULL);
    }
    attrset->dirty = 0;
    fclose(fattr);
    return 0;
ex_set_attr:
ex_fread:
    attrset->dirty = 0;
    fclose(fattr);
    return -1;
}